

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  undefined8 uVar1;
  undefined8 uVar2;
  ushort uVar3;
  int iVar4;
  ulong __n;
  ulong uVar5;
  uint8_t *puVar6;
  uint32_t uVar7;
  uint8_t *input_00;
  ulong delta;
  ulong uVar8;
  uint8_t uVar9;
  uint uVar10;
  code *cb;
  uint uVar11;
  ulong inlen_00;
  uint8_t *puVar12;
  size_t decrypted_length;
  st_ptls_record_t local_78;
  ptls_handshake_properties_t *local_58;
  ulong local_50;
  ulong *local_48;
  ptls_buffer_t *local_40;
  ulong local_38;
  
  uVar1 = local_78._0_8_;
  buf = &tls->recvbuf;
  puVar6 = (tls->recvbuf).rec.base;
  puVar12 = (uint8_t *)*inlen;
  if (puVar12 < (uint8_t *)0x5 || puVar6 != (uint8_t *)0x0) {
    local_78.type = '\0';
    local_78._1_1_ = 0;
    local_78.version = 0;
    local_78._4_4_ = 0;
    local_78.fragment = (uint8_t *)0x0;
    if (puVar6 == (uint8_t *)0x0) goto LAB_0010ec31;
LAB_0010ec83:
    uVar1 = local_78._0_8_;
    puVar12 = puVar12 + (long)input;
    uVar8 = (tls->recvbuf).rec.off;
    while (uVar8 < 5) {
      if ((uint8_t *)input == puVar12) {
        return 0x202;
      }
      uVar9 = *input;
      input = (void *)((long)input + 1);
      puVar6 = (tls->recvbuf).rec.base;
      (tls->recvbuf).rec.off = uVar8 + 1;
      puVar6[uVar8] = uVar9;
      uVar8 = (tls->recvbuf).rec.off;
    }
    puVar6 = (buf->rec).base;
    uVar9 = *puVar6;
    local_78.type = uVar9;
    uVar2 = local_78._0_8_;
    local_78._4_4_ = SUB84(uVar1,4);
    local_78._0_2_ = SUB82(uVar2,0);
    local_78.version = *(ushort *)(puVar6 + 1) << 8 | *(ushort *)(puVar6 + 1) >> 8;
    uVar3 = *(ushort *)(puVar6 + 3) << 8 | *(ushort *)(puVar6 + 3) >> 8;
    inlen_00 = (ulong)uVar3;
    if ((ushort)((uVar9 == '\x17' | 0x40) << 8) < uVar3) {
      return 0x32;
    }
    uVar5 = inlen_00 + 5;
    delta = uVar5 - uVar8;
    local_78.length = inlen_00;
    if (delta != 0) {
      local_58 = properties;
      local_50 = uVar5;
      local_48 = inlen;
      local_40 = decryptbuf;
      iVar4 = ptls_buffer_reserve(&buf->rec,delta);
      if (iVar4 != 0) {
        return iVar4;
      }
      __n = (long)puVar12 - (long)input;
      if (delta < (ulong)((long)puVar12 - (long)input)) {
        __n = delta;
      }
      uVar8 = (tls->recvbuf).rec.off;
      uVar5 = local_50;
      decryptbuf = local_40;
      inlen = local_48;
      properties = local_58;
      if (__n != 0) {
        memcpy((tls->recvbuf).rec.base + uVar8,input,__n);
        input = (void *)((long)input + __n);
        uVar8 = __n + (tls->recvbuf).rec.off;
        (tls->recvbuf).rec.off = uVar8;
        uVar5 = local_50;
        decryptbuf = local_40;
        inlen = local_48;
        properties = local_58;
      }
    }
    if (uVar8 != uVar5) {
      *inlen = (size_t)((long)input + (*inlen - (long)puVar12));
      return 0x202;
    }
    input_00 = (buf->rec).base + 5;
    puVar6 = (uint8_t *)((long)input + (*inlen - (long)puVar12));
  }
  else {
    uVar9 = *input;
    local_78.type = uVar9;
    uVar2 = local_78._0_8_;
    local_78._4_4_ = SUB84(uVar1,4);
    local_78._0_2_ = SUB82(uVar2,0);
    local_78.version = *(ushort *)((long)input + 1) << 8 | *(ushort *)((long)input + 1) >> 8;
    uVar3 = *(ushort *)((long)input + 3) << 8 | *(ushort *)((long)input + 3) >> 8;
    inlen_00 = (ulong)uVar3;
    if ((ushort)((uVar9 == '\x17' | 0x40) << 8) < uVar3) {
      return 0x32;
    }
    puVar6 = (uint8_t *)(inlen_00 + 5);
    if (puVar12 < puVar6) {
LAB_0010ec31:
      local_78.fragment = (uint8_t *)0x0;
      local_78.length = 0;
      local_78.type = '\0';
      local_78._1_1_ = 0;
      local_78.version = 0;
      local_78._4_4_ = 0;
      (tls->recvbuf).rec.base = "";
      (tls->recvbuf).rec.capacity = 0;
      (tls->recvbuf).rec.off = 0;
      (tls->recvbuf).rec.is_allocated = 0;
      iVar4 = ptls_buffer_reserve(&buf->rec,5);
      if (iVar4 != 0) {
        return iVar4;
      }
      goto LAB_0010ec83;
    }
    input_00 = (uint8_t *)((long)input + 5);
    local_78.length = inlen_00;
  }
  *inlen = (size_t)puVar6;
  local_78.fragment = input_00;
  if (uVar9 == '\x14') {
    if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
      return 0x28;
    }
    if ((int)inlen_00 != 1) {
      return 0x2f;
    }
    uVar10 = 0x202;
    if (*input_00 != '\x01') {
      return 0x2f;
    }
    goto LAB_0010ef8a;
  }
  if ((uVar9 == '\x15') || ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
    if ((uVar9 != '\x17') ||
       ((uVar9 = '\x17', (tls->field_0x160 & 1) == 0 ||
        (uVar7 = (tls->field_18).server.early_data_skipped_bytes, uVar7 == 0xffffffff))))
    goto LAB_0010ef29;
  }
  else {
    if (uVar9 != '\x17') {
      return 0x28;
    }
    local_58 = properties;
    iVar4 = ptls_buffer_reserve(decryptbuf,inlen_00 + 5);
    if (iVar4 != 0) {
      return iVar4;
    }
    iVar4 = aead_decrypt(&(tls->traffic_protection).dec,decryptbuf->base + decryptbuf->off,&local_38
                         ,input_00,inlen_00);
    if (iVar4 == 0) {
      inlen_00 = local_38;
      do {
        if (inlen_00 == 0) {
          return 10;
        }
        inlen_00 = inlen_00 - 1;
        uVar9 = (decryptbuf->base + decryptbuf->off)[inlen_00];
      } while (uVar9 == '\0');
      local_78.type = uVar9;
      properties = local_58;
      local_78.length = inlen_00;
      local_78.fragment = decryptbuf->base + decryptbuf->off;
LAB_0010ef29:
      if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (uVar9 != '\x16')) {
        if (uVar9 == '\x15') {
          uVar10 = 0x32;
          if (inlen_00 == 2) {
            uVar10 = local_78.fragment[1] | 0x100;
          }
        }
        else {
          uVar10 = 10;
          if (uVar9 == '\x17') {
            if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
              if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
                 (uVar10 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
                decryptbuf->off = decryptbuf->off + inlen_00;
              }
            }
            else {
              decryptbuf->off = decryptbuf->off + inlen_00;
              uVar10 = 0;
            }
          }
        }
      }
      else {
        cb = handle_server_handshake_message;
        if ((tls->field_0x160 & 1) == 0) {
          cb = handle_client_handshake_message;
        }
        uVar10 = handle_handshake_record(tls,cb,emitter,&local_78,properties);
      }
      goto LAB_0010ef8a;
    }
    if ((tls->field_0x160 & 1) == 0) {
      return iVar4;
    }
    uVar7 = (tls->field_18).server.early_data_skipped_bytes;
    if (uVar7 == 0xffffffff) {
      return iVar4;
    }
  }
  uVar11 = (int)inlen_00 + uVar7;
  (tls->field_18).server.early_data_skipped_bytes = uVar11;
  uVar10 = 0x202;
  if (0x10000 < uVar11) {
    return 0x28;
  }
LAB_0010ef8a:
  ptls_buffer__release_memory(&buf->rec);
  (buf->rec).base = (uint8_t *)0x0;
  (tls->recvbuf).rec.capacity = 0;
  (tls->recvbuf).rec.off = 0;
  *(undefined8 *)&(tls->recvbuf).rec.is_allocated = 0;
  return uVar10;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
        ret = handle_handshake_record(tls, tls->is_server ? handle_server_handshake_message : handle_client_handshake_message,
                                      emitter, &rec, properties);
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}